

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

int32_t icu_63::PropNameData::findPropertyValueNameGroup(int32_t valueMapIndex,int32_t value)

{
  int iVar1;
  int iVar2;
  int32_t v;
  int32_t nameGroupOffsetsStart;
  int32_t valuesStart;
  int32_t limit;
  int32_t start;
  int32_t numRanges;
  int32_t value_local;
  int32_t valueMapIndex_local;
  
  if (valueMapIndex != 0) {
    iVar2 = valueMapIndex + 2;
    limit = (&valueMaps)[valueMapIndex + 1];
    numRanges = iVar2;
    if (limit < 0x10) {
      for (; 0 < limit; limit = limit + -1) {
        iVar2 = (&valueMaps)[numRanges];
        if (value < iVar2) {
          return 0;
        }
        if (value < (int)(&valueMaps)[numRanges + 1]) {
          return (&valueMaps)[(numRanges + 2 + value) - iVar2];
        }
        numRanges = ((&valueMaps)[numRanges + 1] - iVar2) + numRanges + 2;
      }
    }
    else {
      iVar1 = iVar2 + limit + -0x10;
      do {
        if (value < (int)(&valueMaps)[numRanges]) {
          return 0;
        }
        if (value == (&valueMaps)[numRanges]) {
          return (&valueMaps)[(iVar1 + numRanges) - iVar2];
        }
        numRanges = numRanges + 1;
      } while (numRanges < iVar1);
    }
  }
  return 0;
}

Assistant:

int32_t PropNameData::findPropertyValueNameGroup(int32_t valueMapIndex, int32_t value) {
    if(valueMapIndex==0) {
        return 0;  // The property does not have named values.
    }
    ++valueMapIndex;  // Skip the BytesTrie offset.
    int32_t numRanges=valueMaps[valueMapIndex++];
    if(numRanges<0x10) {
        // Ranges of values.
        for(; numRanges>0; --numRanges) {
            // Read and skip the start and limit of this range.
            int32_t start=valueMaps[valueMapIndex];
            int32_t limit=valueMaps[valueMapIndex+1];
            valueMapIndex+=2;
            if(value<start) {
                break;
            }
            if(value<limit) {
                return valueMaps[valueMapIndex+value-start];
            }
            valueMapIndex+=limit-start;  // Skip all entries for this range.
        }
    } else {
        // List of values.
        int32_t valuesStart=valueMapIndex;
        int32_t nameGroupOffsetsStart=valueMapIndex+numRanges-0x10;
        do {
            int32_t v=valueMaps[valueMapIndex];
            if(value<v) {
                break;
            }
            if(value==v) {
                return valueMaps[nameGroupOffsetsStart+valueMapIndex-valuesStart];
            }
        } while(++valueMapIndex<nameGroupOffsetsStart);
    }
    return 0;
}